

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::ClassRandomizeFunction::checkArguments
          (ClassRandomizeFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *thisExpr)

{
  Compilation *pCVar1;
  size_t sVar2;
  Expression *this_00;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  Symbol *pSVar6;
  long lVar7;
  Type *pTVar8;
  ulong uVar9;
  Type *this_01;
  pair<const_slang::ast::ClassType_*,_bool> pVar10;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar4 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,thisExpr != (Expression *)0x0,args,range,
                     0,0x7fffffff);
  lVar7 = 400;
  if (bVar4) {
    uVar9 = (ulong)(thisExpr != (Expression *)0x0);
    plVar5 = (long *)((ulong)((uint)(thisExpr != (Expression *)0x0) * 8) + (long)args->_M_ptr);
    sVar2 = (args->_M_extent)._M_extent_value;
    if (sVar2 - uVar9 == 1) {
      pTVar8 = *(Type **)(*plVar5 + 8);
      if (pTVar8->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar8);
      }
      lVar7 = 0x158;
      if ((pTVar8->canonical->super_Symbol).kind == NullType) goto LAB_004a3962;
    }
    if (thisExpr == (Expression *)0x0) {
      pVar10 = Lookup::getContainingClass((context->scope).ptr);
      pTVar8 = (Type *)&(pVar10.first)->super_Scope;
      this_01 = (Type *)0x0;
      if (pVar10.first == (ClassType *)0x0) {
        pTVar8 = (Type *)0x0;
      }
    }
    else {
      this_01 = (thisExpr->type).ptr;
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
      }
      pTVar8 = this_01->canonical + 1;
    }
    lVar7 = 400;
    if (pTVar8 != (Type *)0x0) {
      bVar4 = sVar2 == uVar9;
      if (!bVar4) {
        lVar7 = 0;
        do {
          this_00 = *(Expression **)((long)plVar5 + lVar7);
          if ((((this_00->kind == NamedValue) &&
               (pSVar6 = Expression::getSymbolReference(this_00,true), pSVar6 != (Symbol *)0x0)) &&
              (pSVar6->kind == ClassProperty)) && ((Type *)pSVar6->parentScope == pTVar8)) {
            bVar3 = true;
          }
          else {
            ASTContext::addDiag(context,(DiagCode)0x8000b,this_00->sourceRange);
            this_01 = pCVar1->errorType;
            bVar3 = false;
          }
          if (!bVar3) break;
          lVar7 = lVar7 + 8;
          bVar4 = uVar9 * -8 + sVar2 * 8 == lVar7;
        } while (!bVar4);
      }
      lVar7 = 0x158;
      if (!bVar4) {
        return this_01;
      }
    }
  }
LAB_004a3962:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar7);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* thisExpr) const final {
        bool isMethod = thisExpr != nullptr;
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, isMethod, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        Args methodArgs = args;
        if (isMethod)
            methodArgs = methodArgs.subspan(1);

        // Special case: a single 'null' argument can be passed to indicate
        // that no variables should be randomized.
        if (methodArgs.size() == 1 && methodArgs[0]->type->isNull())
            return comp.getIntType();

        // This can only be called via a special lookup on a class handle or as a local
        // class member, so we know either the this expression gives us the class type
        // or we can look it up from our current scope.
        const Scope* ct;
        if (thisExpr)
            ct = &thisExpr->type->getCanonicalType().as<ClassType>();
        else
            ct = Lookup::getContainingClass(*context.scope).first;

        if (!ct)
            return comp.getErrorType();

        for (auto arg : methodArgs) {
            if (arg->kind != ExpressionKind::NamedValue) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }

            auto sym = arg->getSymbolReference();
            if (!sym || sym->kind != SymbolKind::ClassProperty || sym->getParentScope() != ct) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getIntType();
    }